

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

int tableAndColumnIndex(SrcList *pSrc,int iStart,int iEnd,char *zCol,int *piTab,int *piCol,
                       int bIgnoreHidden)

{
  Table *pTab;
  uint iCol;
  long lVar1;
  Table **ppTVar2;
  
  lVar1 = (long)iStart;
  ppTVar2 = &pSrc->a[lVar1].pTab;
  while( true ) {
    if (iEnd < lVar1) {
      return 0;
    }
    pTab = *ppTVar2;
    iCol = sqlite3ColumnIndex(pTab,zCol);
    if ((-1 < (int)iCol) && ((bIgnoreHidden == 0 || ((pTab->aCol[iCol].colFlags & 2) == 0)))) break;
    lVar1 = lVar1 + 1;
    ppTVar2 = ppTVar2 + 0xd;
  }
  if (piTab == (int *)0x0) {
    return 1;
  }
  sqlite3SrcItemColumnUsed((SrcItem *)(ppTVar2 + -4),iCol);
  *piTab = (int)lVar1;
  *piCol = iCol;
  return 1;
}

Assistant:

static int tableAndColumnIndex(
  SrcList *pSrc,       /* Array of tables to search */
  int iStart,          /* First member of pSrc->a[] to check */
  int iEnd,            /* Last member of pSrc->a[] to check */
  const char *zCol,    /* Name of the column we are looking for */
  int *piTab,          /* Write index of pSrc->a[] here */
  int *piCol,          /* Write index of pSrc->a[*piTab].pTab->aCol[] here */
  int bIgnoreHidden    /* Ignore hidden columns */
){
  int i;               /* For looping over tables in pSrc */
  int iCol;            /* Index of column matching zCol */

  assert( iEnd<pSrc->nSrc );
  assert( iStart>=0 );
  assert( (piTab==0)==(piCol==0) );  /* Both or neither are NULL */

  for(i=iStart; i<=iEnd; i++){
    iCol = sqlite3ColumnIndex(pSrc->a[i].pTab, zCol);
    if( iCol>=0
     && (bIgnoreHidden==0 || IsHiddenColumn(&pSrc->a[i].pTab->aCol[iCol])==0)
    ){
      if( piTab ){
        sqlite3SrcItemColumnUsed(&pSrc->a[i], iCol);
        *piTab = i;
        *piCol = iCol;
      }
      return 1;
    }
  }
  return 0;
}